

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataType.cpp
# Opt level: O2

string * __thiscall
CoreML::enumeratedShapesToString_abi_cxx11_
          (string *__return_storage_ptr__,CoreML *this,
          vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          *enumerated,bool useArrayFormat)

{
  long lVar1;
  char *__s;
  ulong uVar2;
  string separator;
  string local_1d8;
  stringstream ss;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  __s = " | ";
  if ((int)enumerated != 0) {
    __s = ", ";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&separator,__s,(allocator<char> *)&local_1d8);
  if ((char)enumerated != '\0') {
    std::operator<<(local_1a8,"[");
  }
  lVar1 = 0;
  for (uVar2 = 0; uVar2 < (ulong)((*(long *)(this + 8) - *(long *)this) / 0x18); uVar2 = uVar2 + 1)
  {
    dimensionsToString_abi_cxx11_
              (&local_1d8,(CoreML *)(*(long *)this + lVar1),
               (vector<long,_std::allocator<long>_> *)((ulong)enumerated & 0xff),useArrayFormat);
    std::operator<<(local_1a8,(string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    if (uVar2 < (*(long *)(this + 8) - *(long *)this) / 0x18 - 1U) {
      std::operator<<(local_1a8,(string *)&separator);
    }
    lVar1 = lVar1 + 0x18;
  }
  if ((char)enumerated != '\0') {
    std::operator<<(local_1a8,"]");
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::~string((string *)&separator);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

static std::string enumeratedShapesToString(const std::vector<std::vector<int64_t>> &enumerated, bool useArrayFormat = false) {
        std::stringstream ss;
        std::string separator = useArrayFormat ? ", " : " | ";

        if (useArrayFormat) {
            ss << "[";
        }

        for (size_t i=0; i<enumerated.size(); i++) {
            ss << dimensionsToString(enumerated[i],useArrayFormat);
            if (i < enumerated.size() - 1) { ss << separator; }
        }

        if (useArrayFormat) {
            ss << "]";
        }

        return ss.str();
    }